

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O0

void __thiscall
rr::FragmentProcessor::executeStencilSFail
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,StencilState *stencilState,int numStencilBits,
          PixelBufferAccess *stencilBuffer)

{
  int iVar1;
  int z;
  int iVar2;
  uint oldValue;
  int iVar3;
  Fragment *pFVar4;
  int stencilBufferValue_7;
  Fragment *frag_7;
  int local_d8;
  int fragSampleNdx_7;
  int regSampleNdx_7;
  int stencilBufferValue_6;
  Fragment *frag_6;
  int local_c0;
  int fragSampleNdx_6;
  int regSampleNdx_6;
  int stencilBufferValue_5;
  Fragment *frag_5;
  int local_a8;
  int fragSampleNdx_5;
  int regSampleNdx_5;
  int stencilBufferValue_4;
  Fragment *frag_4;
  int local_90;
  int fragSampleNdx_4;
  int regSampleNdx_4;
  int stencilBufferValue_3;
  Fragment *frag_3;
  int local_78;
  int fragSampleNdx_3;
  int regSampleNdx_3;
  int stencilBufferValue_2;
  Fragment *frag_2;
  int local_60;
  int fragSampleNdx_2;
  int regSampleNdx_2;
  int stencilBufferValue_1;
  Fragment *frag_1;
  int local_48;
  int fragSampleNdx_1;
  int regSampleNdx_1;
  int stencilBufferValue;
  Fragment *frag;
  int fragSampleNdx;
  int regSampleNdx;
  int clampedStencilRef;
  int numStencilBits_local;
  StencilState *stencilState_local;
  Fragment *inputFragments_local;
  int numSamplesPerFragment_local;
  int fragNdxOffset_local;
  FragmentProcessor *this_local;
  
  regSampleNdx._0_1_ = (byte)numStencilBits;
  iVar1 = de::clamp<int>(stencilState->ref,0,(1 << ((byte)regSampleNdx & 0x1f)) + -1);
  switch(stencilState->sFail) {
  case STENCILOP_KEEP:
    for (frag._4_4_ = 0; frag._4_4_ < 0x40; frag._4_4_ = frag._4_4_ + 1) {
      if (((this->m_sampleRegister[frag._4_4_].isAlive & 1U) != 0) &&
         ((this->m_sampleRegister[frag._4_4_].stencilPassed & 1U) == 0)) {
        pFVar4 = inputFragments + (fragNdxOffset + frag._4_4_ / numSamplesPerFragment);
        iVar1 = tcu::Vector<int,_2>::x(&pFVar4->pixelCoord);
        iVar2 = tcu::Vector<int,_2>::y(&pFVar4->pixelCoord);
        iVar1 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,
                           frag._4_4_ % numSamplesPerFragment,iVar1,iVar2);
        iVar1 = maskedBitReplace(iVar1,iVar1,stencilState->writeMask);
        iVar2 = tcu::Vector<int,_2>::x(&pFVar4->pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y(&pFVar4->pixelCoord);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar1,frag._4_4_ % numSamplesPerFragment,iVar2,iVar3);
        this->m_sampleRegister[frag._4_4_].isAlive = false;
      }
    }
    break;
  case STENCILOP_ZERO:
    for (local_48 = 0; local_48 < 0x40; local_48 = local_48 + 1) {
      if (((this->m_sampleRegister[local_48].isAlive & 1U) != 0) &&
         ((this->m_sampleRegister[local_48].stencilPassed & 1U) == 0)) {
        pFVar4 = inputFragments + (fragNdxOffset + local_48 / numSamplesPerFragment);
        iVar1 = tcu::Vector<int,_2>::x(&pFVar4->pixelCoord);
        iVar2 = tcu::Vector<int,_2>::y(&pFVar4->pixelCoord);
        iVar1 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,
                           local_48 % numSamplesPerFragment,iVar1,iVar2);
        iVar1 = maskedBitReplace(iVar1,0,stencilState->writeMask);
        iVar2 = tcu::Vector<int,_2>::x(&pFVar4->pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y(&pFVar4->pixelCoord);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar1,local_48 % numSamplesPerFragment,iVar2,iVar3);
        this->m_sampleRegister[local_48].isAlive = false;
      }
    }
    break;
  case STENCILOP_REPLACE:
    for (local_60 = 0; local_60 < 0x40; local_60 = local_60 + 1) {
      if (((this->m_sampleRegister[local_60].isAlive & 1U) != 0) &&
         ((this->m_sampleRegister[local_60].stencilPassed & 1U) == 0)) {
        pFVar4 = inputFragments + (fragNdxOffset + local_60 / numSamplesPerFragment);
        iVar2 = tcu::Vector<int,_2>::x(&pFVar4->pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y(&pFVar4->pixelCoord);
        iVar2 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,
                           local_60 % numSamplesPerFragment,iVar2,iVar3);
        iVar2 = maskedBitReplace(iVar2,iVar1,stencilState->writeMask);
        iVar3 = tcu::Vector<int,_2>::x(&pFVar4->pixelCoord);
        z = tcu::Vector<int,_2>::y(&pFVar4->pixelCoord);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar2,local_60 % numSamplesPerFragment,iVar3,z);
        this->m_sampleRegister[local_60].isAlive = false;
      }
    }
    break;
  case STENCILOP_INCR:
    for (local_78 = 0; local_78 < 0x40; local_78 = local_78 + 1) {
      if (((this->m_sampleRegister[local_78].isAlive & 1U) != 0) &&
         ((this->m_sampleRegister[local_78].stencilPassed & 1U) == 0)) {
        pFVar4 = inputFragments + (fragNdxOffset + local_78 / numSamplesPerFragment);
        iVar1 = tcu::Vector<int,_2>::x(&pFVar4->pixelCoord);
        iVar2 = tcu::Vector<int,_2>::y(&pFVar4->pixelCoord);
        iVar1 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,
                           local_78 % numSamplesPerFragment,iVar1,iVar2);
        iVar2 = de::clamp<int>(iVar1 + 1,0,(1 << ((byte)regSampleNdx & 0x1f)) + -1);
        iVar1 = maskedBitReplace(iVar1,iVar2,stencilState->writeMask);
        iVar2 = tcu::Vector<int,_2>::x(&pFVar4->pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y(&pFVar4->pixelCoord);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar1,local_78 % numSamplesPerFragment,iVar2,iVar3);
        this->m_sampleRegister[local_78].isAlive = false;
      }
    }
    break;
  case STENCILOP_DECR:
    for (local_90 = 0; local_90 < 0x40; local_90 = local_90 + 1) {
      if (((this->m_sampleRegister[local_90].isAlive & 1U) != 0) &&
         ((this->m_sampleRegister[local_90].stencilPassed & 1U) == 0)) {
        pFVar4 = inputFragments + (fragNdxOffset + local_90 / numSamplesPerFragment);
        iVar1 = tcu::Vector<int,_2>::x(&pFVar4->pixelCoord);
        iVar2 = tcu::Vector<int,_2>::y(&pFVar4->pixelCoord);
        iVar1 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,
                           local_90 % numSamplesPerFragment,iVar1,iVar2);
        iVar2 = de::clamp<int>(iVar1 + -1,0,(1 << ((byte)regSampleNdx & 0x1f)) + -1);
        iVar1 = maskedBitReplace(iVar1,iVar2,stencilState->writeMask);
        iVar2 = tcu::Vector<int,_2>::x(&pFVar4->pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y(&pFVar4->pixelCoord);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar1,local_90 % numSamplesPerFragment,iVar2,iVar3);
        this->m_sampleRegister[local_90].isAlive = false;
      }
    }
    break;
  case STENCILOP_INCR_WRAP:
    for (local_a8 = 0; local_a8 < 0x40; local_a8 = local_a8 + 1) {
      if (((this->m_sampleRegister[local_a8].isAlive & 1U) != 0) &&
         ((this->m_sampleRegister[local_a8].stencilPassed & 1U) == 0)) {
        pFVar4 = inputFragments + (fragNdxOffset + local_a8 / numSamplesPerFragment);
        iVar1 = tcu::Vector<int,_2>::x(&pFVar4->pixelCoord);
        iVar2 = tcu::Vector<int,_2>::y(&pFVar4->pixelCoord);
        iVar1 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,
                           local_a8 % numSamplesPerFragment,iVar1,iVar2);
        iVar1 = maskedBitReplace(iVar1,iVar1 + 1U & (1 << ((byte)regSampleNdx & 0x1f)) - 1U,
                                 stencilState->writeMask);
        iVar2 = tcu::Vector<int,_2>::x(&pFVar4->pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y(&pFVar4->pixelCoord);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar1,local_a8 % numSamplesPerFragment,iVar2,iVar3);
        this->m_sampleRegister[local_a8].isAlive = false;
      }
    }
    break;
  case STENCILOP_DECR_WRAP:
    for (local_c0 = 0; local_c0 < 0x40; local_c0 = local_c0 + 1) {
      if (((this->m_sampleRegister[local_c0].isAlive & 1U) != 0) &&
         ((this->m_sampleRegister[local_c0].stencilPassed & 1U) == 0)) {
        pFVar4 = inputFragments + (fragNdxOffset + local_c0 / numSamplesPerFragment);
        iVar1 = tcu::Vector<int,_2>::x(&pFVar4->pixelCoord);
        iVar2 = tcu::Vector<int,_2>::y(&pFVar4->pixelCoord);
        iVar1 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,
                           local_c0 % numSamplesPerFragment,iVar1,iVar2);
        iVar1 = maskedBitReplace(iVar1,iVar1 - 1U & (1 << ((byte)regSampleNdx & 0x1f)) - 1U,
                                 stencilState->writeMask);
        iVar2 = tcu::Vector<int,_2>::x(&pFVar4->pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y(&pFVar4->pixelCoord);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar1,local_c0 % numSamplesPerFragment,iVar2,iVar3);
        this->m_sampleRegister[local_c0].isAlive = false;
      }
    }
    break;
  case STENCILOP_INVERT:
    for (local_d8 = 0; local_d8 < 0x40; local_d8 = local_d8 + 1) {
      if (((this->m_sampleRegister[local_d8].isAlive & 1U) != 0) &&
         ((this->m_sampleRegister[local_d8].stencilPassed & 1U) == 0)) {
        pFVar4 = inputFragments + (fragNdxOffset + local_d8 / numSamplesPerFragment);
        iVar1 = tcu::Vector<int,_2>::x(&pFVar4->pixelCoord);
        iVar2 = tcu::Vector<int,_2>::y(&pFVar4->pixelCoord);
        oldValue = tcu::ConstPixelBufferAccess::getPixStencil
                             (&stencilBuffer->super_ConstPixelBufferAccess,
                              local_d8 % numSamplesPerFragment,iVar1,iVar2);
        iVar1 = maskedBitReplace(oldValue,(oldValue ^ 0xffffffff) &
                                          (1 << ((byte)regSampleNdx & 0x1f)) - 1U,
                                 stencilState->writeMask);
        iVar2 = tcu::Vector<int,_2>::x(&pFVar4->pixelCoord);
        iVar3 = tcu::Vector<int,_2>::y(&pFVar4->pixelCoord);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar1,local_d8 % numSamplesPerFragment,iVar2,iVar3);
        this->m_sampleRegister[local_d8].isAlive = false;
      }
    }
  }
  return;
}

Assistant:

void FragmentProcessor::executeStencilSFail (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, const StencilState& stencilState, int numStencilBits, const tcu::PixelBufferAccess& stencilBuffer)
{
#define SAMPLE_REGISTER_SFAIL(SFAIL_EXPRESSION)																																		\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)																									\
	{																																												\
		if (m_sampleRegister[regSampleNdx].isAlive && !m_sampleRegister[regSampleNdx].stencilPassed)																				\
		{																																											\
			int					fragSampleNdx		= regSampleNdx % numSamplesPerFragment;																							\
			const Fragment&		frag				= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];															\
			int					stencilBufferValue	= stencilBuffer.getPixStencil(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());											\
																																													\
			stencilBuffer.setPixStencil(maskedBitReplace(stencilBufferValue, (SFAIL_EXPRESSION), stencilState.writeMask), fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());	\
			m_sampleRegister[regSampleNdx].isAlive = false;																															\
		}																																											\
	}

	int clampedStencilRef = de::clamp(stencilState.ref, 0, (1<<numStencilBits)-1);

	switch (stencilState.sFail)
	{
		case STENCILOP_KEEP:		SAMPLE_REGISTER_SFAIL(stencilBufferValue)												break;
		case STENCILOP_ZERO:		SAMPLE_REGISTER_SFAIL(0)																break;
		case STENCILOP_REPLACE:		SAMPLE_REGISTER_SFAIL(clampedStencilRef)												break;
		case STENCILOP_INCR:		SAMPLE_REGISTER_SFAIL(de::clamp(stencilBufferValue+1, 0, (1<<numStencilBits) - 1))		break;
		case STENCILOP_DECR:		SAMPLE_REGISTER_SFAIL(de::clamp(stencilBufferValue-1, 0, (1<<numStencilBits) - 1))		break;
		case STENCILOP_INCR_WRAP:	SAMPLE_REGISTER_SFAIL((stencilBufferValue + 1) & ((1<<numStencilBits) - 1))				break;
		case STENCILOP_DECR_WRAP:	SAMPLE_REGISTER_SFAIL((stencilBufferValue - 1) & ((1<<numStencilBits) - 1))				break;
		case STENCILOP_INVERT:		SAMPLE_REGISTER_SFAIL((~stencilBufferValue) & ((1<<numStencilBits) - 1))				break;
		default:
			DE_ASSERT(false);
	}

#undef SAMPLE_REGISTER_SFAIL
}